

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPFromClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPFromClause *this)

{
  string clause_string;
  allocator<char> local_50 [8];
  ulong local_48;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"from ",local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"(",(allocator<char> *)&local_30);
  if (this->from_kind == OMPC_FROM_mapper) {
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::string((string *)&local_30,(string *)&this->mapper_identifier);
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::append((char *)local_50);
  }
  if (1 < local_48) {
    std::__cxx11::string::append((char *)local_50);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_30,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)local_50);
  if (3 < local_48) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPFromClause::toString() {

    std::string result = "from ";
    std::string clause_string = "(";
    OpenMPFromClauseKind from_kind = this->getKind();
    switch (from_kind) {
        case OMPC_FROM_mapper:
            clause_string += "mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
   if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}